

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::objectivec::FieldGeneratorMap::SetOneofIndexBase
          (FieldGeneratorMap *this,int index_base)

{
  scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator> *psVar1;
  long i;
  
  if (0 < *(int *)(this->descriptor_ + 0x2c)) {
    i = 0;
    do {
      psVar1 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator>_>
               ::operator[](&this->field_generators_,i);
      if (psVar1->ptr_ == (FieldGenerator *)0x0) {
        __assert_fail("ptr_ != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/scoped_ptr.h"
                      ,0x5f,
                      "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::objectivec::FieldGenerator>::operator->() const [C = google::protobuf::compiler::objectivec::FieldGenerator]"
                     );
      }
      FieldGenerator::SetOneofIndexBase(psVar1->ptr_,index_base);
      i = i + 1;
    } while (i < *(int *)(this->descriptor_ + 0x2c));
  }
  return;
}

Assistant:

void FieldGeneratorMap::SetOneofIndexBase(int index_base) {
  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_[i]->SetOneofIndexBase(index_base);
  }
}